

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuregistrarproxy_p.h
# Opt level: O2

QDBusReply<QString> * __thiscall
QDBusMenuRegistrarInterface::GetMenuForWindow
          (QDBusReply<QString> *__return_storage_ptr__,QDBusMenuRegistrarInterface *this,
          uint windowId,QDBusObjectPath *menuObjectPath)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  int iVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<QVariant> local_68;
  QDBusMessage reply;
  uint windowId_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _reply = &DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)0x0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_68.ptr = (QVariant *)0x6195aa;
  local_88.size = 0;
  local_68.size = 0x10;
  QDBusAbstractInterface::call<unsigned_int&>
            ((QDBusAbstractInterface *)&reply,(CallMode)this,(QString *)0x1,(uint *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  QDBusMessage::arguments();
  iVar5 = QDBusMessage::type();
  if ((iVar5 == 2) && ((undefined1 *)local_68.size == (undefined1 *)0x2)) {
    qdbus_cast<QDBusObjectPath>((QDBusObjectPath *)&local_88,local_68.ptr + 1);
    pDVar3 = (menuObjectPath->m_path).d.d;
    pcVar4 = (menuObjectPath->m_path).d.ptr;
    (menuObjectPath->m_path).d.d = local_88.d;
    (menuObjectPath->m_path).d.ptr = local_88.ptr;
    qVar2 = (menuObjectPath->m_path).d.size;
    (menuObjectPath->m_path).d.size = local_88.size;
    local_88.d = pDVar3;
    local_88.ptr = pcVar4;
    local_88.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QDBusReply<QString>::QDBusReply(__return_storage_ptr__,&reply);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_68);
  QDBusMessage::~QDBusMessage(&reply);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDBusReply<QString> GetMenuForWindow(uint windowId, QDBusObjectPath &menuObjectPath)
    {
        QDBusMessage reply = call(QDBus::Block, QStringLiteral("GetMenuForWindow"), windowId);
        QList<QVariant> arguments = reply.arguments();
        if (reply.type() == QDBusMessage::ReplyMessage && arguments.size() == 2)
            menuObjectPath = qdbus_cast<QDBusObjectPath>(arguments.at(1));
        return reply;
    }